

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O1

wchar_t read_header(archive_read *a,archive_entry *entry)

{
  byte bVar1;
  mtree *mtree;
  bool bVar2;
  int iVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  mode_t mVar6;
  mtree_entry *pmVar7;
  int *piVar8;
  la_int64_t lVar9;
  char *pcVar10;
  archive_entry_linkresolver *res;
  void *__s;
  void *pvVar11;
  archive_string *paVar12;
  ushort **ppuVar13;
  mtree_entry **ppmVar14;
  long lVar15;
  size_t sVar16;
  archive_rb_node *paVar17;
  archive_rb_node *paVar18;
  size_t len;
  byte *pbVar19;
  char *pcVar20;
  char *pcVar21;
  size_t sVar22;
  byte *pbVar23;
  timespec *ptVar24;
  byte *pbVar25;
  long lVar26;
  ulong uVar27;
  byte *__s1;
  archive_entry **ppaVar28;
  ulong uVar29;
  long lVar30;
  stat *__buf;
  mtree_option *global;
  archive_entry *sparse_entry;
  stat_conflict st_storage;
  archive_entry *local_128;
  archive_string *local_120;
  archive_read *local_118;
  mtree_entry *local_110;
  wchar_t local_104;
  byte *local_100;
  mtree_entry *local_f8;
  mtree_entry *local_f0;
  archive_rb_tree *local_e8;
  archive_rb_tree *local_e0;
  int local_d8 [2];
  mtree_entry **local_d0;
  archive_entry *local_c8;
  stat local_c0;
  
  mtree = (mtree *)a->format->data;
  local_118 = a;
  local_c8 = entry;
  if (L'\xffffffff' < mtree->fd) {
    close(mtree->fd);
    mtree->fd = L'\xffffffff';
  }
  if (mtree->entries == (mtree_entry *)0x0) {
    res = archive_entry_linkresolver_new();
    mtree->resolver = res;
    if (res == (archive_entry_linkresolver *)0x0) {
      return L'\xffffffe2';
    }
    local_d0 = &mtree->entries;
    archive_entry_linkresolver_set_strategy(res,0x80000);
    mtree->archive_format = L'\x00080000';
    mtree->archive_format_name = "mtree";
    local_128 = (archive_entry *)0x0;
    detect_form(local_118,local_d8);
    local_e0 = &mtree->rbtree;
    local_e8 = (archive_rb_tree *)0x1;
    local_110 = (mtree_entry *)0x0;
LAB_0014dc0a:
    __s = __archive_read_ahead(local_118,1,(ssize_t *)&local_c0);
    if (__s != (void *)0x0) {
      lVar26 = 0;
      uVar27 = 0;
      do {
        uVar29 = 0xffffffffffffffe2;
        paVar12 = local_120;
        if ((long)local_c0.st_dev < 0) goto LAB_0014dd50;
        pvVar11 = memchr(__s,10,local_c0.st_dev);
        if (pvVar11 != (void *)0x0) {
          local_c0.st_dev = (long)pvVar11 + (1 - (long)__s);
        }
        if (0xffff < (long)(local_c0.st_dev + uVar27)) {
          iVar3 = 0x54;
          pcVar10 = "Line too long";
LAB_0014dfa4:
          archive_set_error(&local_118->archive,iVar3,pcVar10);
          paVar12 = local_120;
          goto LAB_0014dd50;
        }
        paVar12 = archive_string_ensure((archive_string *)mtree,local_c0.st_dev + uVar27 + 1);
        if (paVar12 == (archive_string *)0x0) {
          iVar3 = 0xc;
          pcVar10 = "Can\'t allocate working buffer";
          goto LAB_0014dfa4;
        }
        memcpy((mtree->line).s + uVar27,__s,local_c0.st_dev);
        __archive_read_consume(local_118,local_c0.st_dev);
        uVar29 = uVar27 + local_c0.st_dev;
        (mtree->line).s[uVar29] = '\0';
        paVar12 = (archive_string *)(mtree->line).s;
        pbVar25 = (byte *)((long)paVar12 + lVar26);
LAB_0014dcc5:
        bVar1 = *pbVar25;
        if (bVar1 < 0x5c) {
          if (bVar1 == 0x23) {
            if (pvVar11 == (void *)0x0) goto LAB_0014dd09;
          }
          else {
            if (bVar1 == 0) goto LAB_0014dd09;
            if (bVar1 == 10) goto LAB_0014dd50;
          }
LAB_0014dcfa:
          pbVar25 = pbVar25 + 1;
          goto LAB_0014dcc5;
        }
        if ((bVar1 != 0x5c) || (pbVar25[1] == 0)) goto LAB_0014dcfa;
        if (pbVar25[1] != 10) {
          pbVar25 = pbVar25 + 1;
          goto LAB_0014dcfa;
        }
        *(byte *)((long)paVar12 + (uVar29 - 2)) = 0;
        uVar29 = uVar29 - 2;
LAB_0014dd09:
        lVar26 = (long)pbVar25 - (long)(mtree->line).s;
        __s = __archive_read_ahead(local_118,1,(ssize_t *)&local_c0);
        uVar27 = uVar29;
      } while (__s != (void *)0x0);
    }
    uVar29 = 0;
    paVar12 = local_120;
LAB_0014dd50:
    if (uVar29 == 0) {
      mtree->this_entry = mtree->entries;
      free_options((mtree_option *)local_128);
      wVar4 = L'\0';
      goto LAB_0014e369;
    }
    if (-1 < (long)uVar29) {
      lVar26 = 0;
      pbVar25 = (byte *)paVar12;
      while( true ) {
        pbVar25 = pbVar25 + 1;
        bVar1 = *(byte *)((long)paVar12 + lVar26);
        uVar27 = (ulong)bVar1;
        if (0x23 < uVar27) break;
        if ((0x100000200U >> (uVar27 & 0x3f) & 1) == 0) {
          if ((0x800002401U >> (uVar27 & 0x3f) & 1) != 0) goto LAB_0014dd8f;
          break;
        }
        lVar26 = lVar26 + 1;
      }
      pbVar23 = (byte *)((long)paVar12 + lVar26);
      lVar30 = uVar29 - lVar26;
      __s1 = pbVar23;
      local_120 = paVar12;
      if (pbVar23 < pbVar23 + lVar30 + -1) {
        local_100 = pbVar23;
        ppuVar13 = __ctype_b_loc();
        pbVar19 = local_100;
        do {
          if ((*pbVar19 != 9) && (((*ppuVar13)[*pbVar19] & 0x4000) == 0)) goto LAB_0014e327;
          pbVar19 = pbVar19 + 1;
          __s1 = local_100;
        } while (pbVar19 < pbVar23 + lVar30 + -1);
      }
      iVar3 = local_d8[0];
      if (bVar1 != 0x2f) {
        local_100 = __s1;
        pmVar7 = (mtree_entry *)malloc(0x40);
        pbVar23 = local_100;
        if (pmVar7 != (mtree_entry *)0x0) {
          *(undefined8 *)((long)&pmVar7->options + 2) = 0;
          *(undefined8 *)((long)&pmVar7->name + 2) = 0;
          pmVar7->next = (mtree_entry *)0x0;
          pmVar7->options = (mtree_option *)0x0;
          ppmVar14 = &local_110->next;
          if (local_110 == (mtree_entry *)0x0) {
            ppmVar14 = local_d0;
          }
          *ppmVar14 = pmVar7;
          local_f8 = pmVar7;
          local_f0 = pmVar7;
          if (iVar3 == L'\0') {
            pbVar25 = (byte *)strcspn((char *)local_100," \t\r\n");
            pbVar23 = pbVar25 + (long)pbVar23;
            local_110 = (mtree_entry *)(pbVar23 + lVar30);
          }
          else {
            do {
              if (lVar30 < 1) break;
              bVar2 = false;
              if (((ulong)*(byte *)((long)local_120 + lVar26 + -1 + lVar30) < 0x21) &&
                 ((0x100002600U >> ((ulong)*(byte *)((long)local_120 + lVar26 + -1 + lVar30) & 0x3f)
                  & 1) != 0)) {
                lVar30 = lVar30 + -1;
                bVar2 = true;
              }
            } while (bVar2);
            lVar15 = lVar30;
            local_110 = (mtree_entry *)local_100;
            if (0 < lVar30) {
              do {
                if (((ulong)pbVar25[-1] < 0x21) &&
                   ((0x100002600U >> ((ulong)pbVar25[-1] & 0x3f) & 1) != 0)) {
                  local_110 = (mtree_entry *)pbVar25;
                }
                pbVar25 = pbVar25 + 1;
                lVar15 = lVar15 + -1;
              } while (lVar15 != 0);
            }
            pbVar25 = local_100 + (lVar30 - (long)local_110);
            local_100 = (byte *)local_110;
          }
          pcVar10 = (char *)malloc((size_t)(pbVar25 + 1));
          local_f8->name = pcVar10;
          if (pcVar10 == (char *)0x0) {
            piVar8 = __errno_location();
            archive_set_error(&local_118->archive,*piVar8,"Can\'t allocate memory");
            uVar29 = 0xffffffe2;
LAB_0014e18d:
            local_110 = local_f8;
            paVar12 = local_120;
            goto LAB_0014e308;
          }
          memcpy(pcVar10,local_100,(size_t)pbVar25);
          pmVar7 = local_f8;
          pcVar10[(long)pbVar25] = '\0';
          parse_escapes(pcVar10,local_f8);
          pmVar7->next_dup = (mtree_entry *)0x0;
          if (((pmVar7->full != '\0') &&
              (iVar3 = __archive_rb_tree_insert_node(local_e0,&pmVar7->rbnode), iVar3 == 0)) &&
             (paVar17 = __archive_rb_tree_find_node(local_e0,pmVar7->name),
             paVar17 != (archive_rb_node *)0x0)) {
            do {
              paVar18 = paVar17;
              paVar17 = paVar18[1].rb_nodes[0];
            } while (paVar17 != (archive_rb_node *)0x0);
            paVar18[1].rb_nodes[0] = &pmVar7->rbnode;
          }
          local_f0 = (mtree_entry *)&local_f0->options;
          ppaVar28 = &local_128;
          do {
            ppaVar28 = (archive_entry **)*ppaVar28;
            if (ppaVar28 == (archive_entry **)0x0) goto LAB_0014e1a3;
            pcVar10 = (char *)((long *)ppaVar28)[1];
            sVar16 = strlen(pcVar10);
            wVar4 = add_option(local_118,(mtree_option **)local_f0,pcVar10,sVar16);
          } while (wVar4 == L'\0');
          goto LAB_0014e234;
        }
        piVar8 = __errno_location();
        archive_set_error(&local_118->archive,*piVar8,"Can\'t allocate memory");
        uVar29 = 0xffffffe2;
        paVar12 = local_120;
        goto LAB_0014e308;
      }
      if ((lVar30 < 5) || (iVar3 = strncmp((char *)__s1,"/set",4), iVar3 != 0)) {
        if (((6 < lVar30) &&
            (iVar3 = strncmp((char *)__s1,"/unset",6), paVar12 = local_120, iVar3 == 0)) &&
           ((*(byte *)((long)local_120 + lVar26 + 6) == 0x20 ||
            (*(byte *)((long)local_120 + lVar26 + 6) == 9)))) {
          pbVar25 = (byte *)((long)local_120 + lVar26 + 6);
          pcVar10 = strchr((char *)pbVar25,0x3d);
          if (pcVar10 == (char *)0x0) {
            sVar16 = strspn((char *)pbVar25," \t\r\n");
            uVar29 = 0;
            if (*(byte *)((long)paVar12 + lVar26 + 6 + sVar16) != 0) {
              pbVar25 = (byte *)((long)paVar12 + lVar26 + sVar16 + 6);
              do {
                sVar16 = strcspn((char *)pbVar25," \t\r\n");
                if ((sVar16 == 3) && (iVar3 = strncmp((char *)pbVar25,"all",3), iVar3 == 0)) {
                  free_options((mtree_option *)local_128);
                  local_128 = (archive_entry *)0x0;
                }
                else {
                  remove_option((mtree_option **)&local_128,(char *)pbVar25,sVar16);
                }
                pbVar23 = pbVar25 + sVar16;
                sVar16 = strspn((char *)pbVar23," \t\r\n");
                pbVar25 = pbVar23 + sVar16;
                paVar12 = local_120;
              } while (pbVar23[sVar16] != 0);
            }
          }
          else {
            archive_set_error(&local_118->archive,-1,"/unset shall not contain `=\'");
            uVar29 = 0xffffffe2;
          }
          goto LAB_0014e308;
        }
      }
      else if ((*(byte *)((long)local_120 + lVar26 + 4) == 0x20) ||
              (*(byte *)((long)local_120 + lVar26 + 4) == 9)) {
        pmVar7 = (mtree_entry *)((long)local_120 + lVar26 + 4);
        do {
          sVar16 = strspn((char *)pmVar7," \t\r\n");
          if (*(byte *)((long)(pmVar7->rbnode).rb_nodes + sVar16) == 0) {
            uVar29 = 0;
            paVar12 = local_120;
            goto LAB_0014e308;
          }
          pbVar25 = (byte *)((long)(pmVar7->rbnode).rb_nodes + sVar16);
          sVar16 = strcspn((char *)pbVar25," \t\r\n");
          local_f0 = (mtree_entry *)(pbVar25 + sVar16);
          pmVar7 = (mtree_entry *)strchr((char *)pbVar25,0x3d);
          sVar22 = (long)pmVar7 - (long)pbVar25;
          if ((mtree_entry *)(pbVar25 + sVar16) < pmVar7) {
            sVar22 = sVar16;
          }
          remove_option((mtree_option **)&local_128,(char *)pbVar25,sVar22);
          wVar4 = add_option(local_118,(mtree_option **)&local_128,(char *)pbVar25,sVar16);
          pmVar7 = local_f0;
        } while (wVar4 == L'\0');
        uVar29 = (ulong)(uint)wVar4;
        paVar12 = local_120;
        goto LAB_0014e308;
      }
LAB_0014e327:
      archive_set_error(&local_118->archive,0x54,"Can\'t parse line %ju",local_e8);
      free_options((mtree_option *)local_128);
      wVar4 = L'\xffffffe2';
      goto LAB_0014e369;
    }
LAB_0014e311:
    wVar4 = (wchar_t)uVar29;
    free_options((mtree_option *)local_128);
LAB_0014e369:
    if (wVar4 != L'\0') {
      return wVar4;
    }
  }
  (local_118->archive).archive_format = mtree->archive_format;
  (local_118->archive).archive_format_name = mtree->archive_format_name;
  pmVar7 = mtree->this_entry;
  if (pmVar7 != (mtree_entry *)0x0) {
    local_e8 = &mtree->rbtree;
    paVar12 = &mtree->current_dir;
    local_120 = paVar12;
    do {
      iVar3 = strcmp(pmVar7->name,"..");
      if (iVar3 == 0) {
        pmVar7->used = '\x01';
        sVar22 = (mtree->current_dir).length;
        if (sVar22 != 0) {
          pcVar10 = (mtree->current_dir).s;
          pcVar20 = pcVar10 + sVar22;
          do {
            pcVar21 = pcVar20;
            pcVar20 = pcVar21 + -1;
            if (pcVar20 < pcVar10) break;
          } while (*pcVar20 != '/');
          pcVar21 = pcVar21 + -2;
          if (pcVar20 < pcVar10) {
            pcVar21 = pcVar20;
          }
          (mtree->current_dir).length = (size_t)(pcVar21 + (1 - (long)pcVar10));
        }
      }
      if (pmVar7->used == '\0') {
        local_128 = local_c8;
        pmVar7->used = '\x01';
        archive_entry_set_filetype(local_c8,0x8000);
        archive_entry_set_size(local_128,0);
        (mtree->contents_name).length = 0;
        local_104 = L'\0';
        wVar4 = parse_line(local_118,local_128,mtree,pmVar7,&local_104);
        if (pmVar7->full == '\0') {
          sVar22 = (mtree->current_dir).length;
          if (sVar22 != 0) {
            archive_strcat(paVar12,"/");
          }
          archive_strcat(paVar12,pmVar7->name);
          archive_entry_copy_pathname(local_128,paVar12->s);
          mVar6 = archive_entry_filetype(local_128);
          if (mVar6 != 0x4000) {
            (mtree->current_dir).length = sVar22;
          }
        }
        else {
          archive_entry_copy_pathname(local_128,pmVar7->name);
          for (pmVar7 = (mtree_entry *)__archive_rb_tree_find_node(local_e8,pmVar7->name);
              pmVar7 != (mtree_entry *)0x0; pmVar7 = pmVar7->next_dup) {
            if ((pmVar7->full != '\0') && (pmVar7->used == '\0')) {
              pmVar7->used = '\x01';
              wVar5 = parse_line(local_118,local_128,mtree,pmVar7,&local_104);
              if (wVar5 < wVar4) {
                wVar4 = wVar5;
              }
            }
          }
        }
        if (mtree->checkfs == '\0') {
LAB_0014dad6:
          lVar9 = archive_entry_size(local_128);
          mtree->cur_size = lVar9;
          mtree->offset = 0;
          bVar2 = true;
          wVar5 = wVar4;
        }
        else {
          mtree->fd = L'\xffffffff';
          if ((mtree->contents_name).length == 0) {
            pcVar10 = archive_entry_pathname(local_128);
          }
          else {
            pcVar10 = (mtree->contents_name).s;
          }
          __buf = &local_c0;
          mVar6 = archive_entry_filetype(local_128);
          if ((mVar6 == 0x8000) || (mVar6 = archive_entry_filetype(local_128), mVar6 == 0x4000)) {
            wVar5 = open(pcVar10,0x80000);
            mtree->fd = wVar5;
            __archive_ensure_cloexec_flag(wVar5);
            if (mtree->fd == L'\xffffffff') {
              piVar8 = __errno_location();
              if ((*piVar8 != 2) || ((mtree->contents_name).length != 0)) {
                archive_set_error(&local_118->archive,*piVar8,"Can\'t open %s",pcVar10);
                wVar4 = L'\xffffffec';
              }
            }
          }
          if (mtree->fd < L'\0') {
            iVar3 = lstat(pcVar10,__buf);
            if (iVar3 == -1) goto LAB_0014d89d;
            ptVar24 = &local_c0.st_mtim;
          }
          else {
            iVar3 = fstat(mtree->fd,__buf);
            ptVar24 = &local_c0.st_mtim;
            if (iVar3 == -1) {
              piVar8 = __errno_location();
              archive_set_error(&local_118->archive,*piVar8,"Could not fstat %s",pcVar10);
              close(mtree->fd);
              mtree->fd = L'\xffffffff';
              wVar4 = L'\xffffffec';
LAB_0014d89d:
              ptVar24 = (timespec *)0x58;
              __buf = (stat *)0x0;
            }
          }
          if (__buf == (stat *)0x0) {
            bVar2 = false;
            wVar5 = L'\0';
            if ((local_104 & 0x800U) == 0) goto LAB_0014dad6;
          }
          else {
            if (((((((__buf->st_mode & 0xf000) == 0x8000) &&
                   (mVar6 = archive_entry_filetype(local_128), mVar6 == 0x8000)) ||
                  (((__buf->st_mode & 0xf000) == 0xa000 &&
                   (mVar6 = archive_entry_filetype(local_128), mVar6 == 0xa000)))) ||
                 ((((~__buf->st_mode & 0xc000) == 0 &&
                   (mVar6 = archive_entry_filetype(local_128), mVar6 == 0xc000)) ||
                  (((__buf->st_mode & 0xf000) == 0x2000 &&
                   (mVar6 = archive_entry_filetype(local_128), mVar6 == 0x2000)))))) ||
                ((((__buf->st_mode & 0xf000) == 0x6000 &&
                  (mVar6 = archive_entry_filetype(local_128), mVar6 == 0x6000)) ||
                 (((__buf->st_mode & 0xf000) == 0x4000 &&
                  (mVar6 = archive_entry_filetype(local_128), mVar6 == 0x4000)))))) ||
               (((__buf->st_mode & 0xf000) == 0x1000 &&
                (mVar6 = archive_entry_filetype(local_128), mVar6 == 0x1000)))) {
              wVar5 = local_104;
              if (((local_104 & 0x1001U) != 1) &&
                 ((mVar6 = archive_entry_filetype(local_128), mVar6 == 0x2000 ||
                  (mVar6 = archive_entry_filetype(local_128), mVar6 == 0x6000)))) {
                archive_entry_set_rdev(local_128,__buf->st_rdev);
              }
              if ((wVar5 & 0xcU) == 0 || ((uint)wVar5 >> 0xc & 1) != 0) {
                archive_entry_set_gid(local_128,(ulong)__buf->st_gid);
              }
              if ((wVar5 & 0x600U) == 0 || ((uint)wVar5 >> 0xc & 1) != 0) {
                archive_entry_set_uid(local_128,(ulong)__buf->st_uid);
              }
              if ((wVar5 & 0x1010U) != 0x10) {
                archive_entry_set_mtime(local_128,(__buf->st_mtim).tv_sec,ptVar24->tv_nsec);
              }
              if ((wVar5 & 0x1020U) != 0x20) {
                archive_entry_set_nlink(local_128,(uint)__buf->st_nlink);
              }
              if ((wVar5 & 0x1040U) != 0x40) {
                archive_entry_set_perm(local_128,__buf->st_mode);
              }
              if ((wVar5 & 0x1080U) != 0x80) {
                archive_entry_set_size(local_128,__buf->st_size);
              }
              archive_entry_set_ino(local_128,__buf->st_ino);
              archive_entry_set_dev(local_128,__buf->st_dev);
              archive_entry_linkify(mtree->resolver,&local_128,(archive_entry **)local_d8);
              goto LAB_0014dad6;
            }
            if (L'\xffffffff' < mtree->fd) {
              close(mtree->fd);
            }
            mtree->fd = L'\xffffffff';
            wVar5 = wVar4;
            if ((local_104 & 0x800U) == 0) {
              bVar2 = true;
              if (wVar4 == L'\0') {
                pcVar10 = archive_entry_pathname(local_128);
                archive_set_error(&local_118->archive,-1,
                                  "mtree specification has different type for %s",pcVar10);
                wVar5 = L'\xffffffec';
                bVar2 = true;
              }
            }
            else {
              bVar2 = false;
            }
          }
        }
        paVar12 = local_120;
        if (bVar2) {
          return wVar5;
        }
      }
      pmVar7 = mtree->this_entry->next;
      mtree->this_entry = pmVar7;
    } while (pmVar7 != (mtree_entry *)0x0);
  }
  return L'\x01';
  while( true ) {
    len = strcspn((char *)pbVar23," \t\r\n");
    local_100 = pbVar23 + len;
    pbVar25 = (byte *)strchr((char *)pbVar23,0x3d);
    pmVar7 = local_f0;
    sVar16 = (long)pbVar25 - (long)pbVar23;
    if (pbVar23 + len < pbVar25) {
      sVar16 = len;
    }
    if (pbVar25 == (byte *)0x0) {
      sVar16 = len;
    }
    remove_option((mtree_option **)local_f0,(char *)pbVar23,sVar16);
    wVar4 = add_option(local_118,(mtree_option **)pmVar7,(char *)pbVar23,len);
    pbVar23 = local_100;
    if (wVar4 != L'\0') break;
LAB_0014e1a3:
    sVar16 = strspn((char *)pbVar23," \t\r\n");
    uVar29 = 0;
    if ((pbVar23[sVar16] == 0) || (pbVar23 = pbVar23 + sVar16, local_110 <= pbVar23))
    goto LAB_0014e18d;
  }
LAB_0014e234:
  uVar29 = (ulong)(uint)wVar4;
  local_110 = local_f8;
  paVar12 = local_120;
LAB_0014e308:
  if ((int)uVar29 != 0) goto LAB_0014e311;
LAB_0014dd8f:
  local_e8 = (archive_rb_tree *)((long)local_e8 + 1);
  local_120 = (archive_string *)((long)paVar12 + lVar26);
  goto LAB_0014dc0a;
}

Assistant:

static int
read_header(struct archive_read *a, struct archive_entry *entry)
{
	struct mtree *mtree;
	char *p;
	int r, use_next;

	mtree = (struct mtree *)(a->format->data);

	if (mtree->fd >= 0) {
		close(mtree->fd);
		mtree->fd = -1;
	}

	if (mtree->entries == NULL) {
		mtree->resolver = archive_entry_linkresolver_new();
		if (mtree->resolver == NULL)
			return ARCHIVE_FATAL;
		archive_entry_linkresolver_set_strategy(mtree->resolver,
		    ARCHIVE_FORMAT_MTREE);
		r = read_mtree(a, mtree);
		if (r != ARCHIVE_OK)
			return (r);
	}

	a->archive.archive_format = mtree->archive_format;
	a->archive.archive_format_name = mtree->archive_format_name;

	for (;;) {
		if (mtree->this_entry == NULL)
			return (ARCHIVE_EOF);
		if (strcmp(mtree->this_entry->name, "..") == 0) {
			mtree->this_entry->used = 1;
			if (archive_strlen(&mtree->current_dir) > 0) {
				/* Roll back current path. */
				p = mtree->current_dir.s
				    + mtree->current_dir.length - 1;
				while (p >= mtree->current_dir.s && *p != '/')
					--p;
				if (p >= mtree->current_dir.s)
					--p;
				mtree->current_dir.length
				    = p - mtree->current_dir.s + 1;
			}
		}
		if (!mtree->this_entry->used) {
			use_next = 0;
			r = parse_file(a, entry, mtree, mtree->this_entry,
				&use_next);
			if (use_next == 0)
				return (r);
		}
		mtree->this_entry = mtree->this_entry->next;
	}
}